

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ArenaStringPtr::CreateInstance
          (ArenaStringPtr *this,Arena *arena,string *initial_value)

{
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *object;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (initial_value == (string *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/arenastring.h"
               ,0x128);
    other = LogMessage::operator<<(&local_58,"CHECK failed: initial_value != NULL: ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  object = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
  std::__cxx11::string::string((string *)object,(string *)initial_value);
  this->ptr_ = object;
  if (arena != (Arena *)0x0) {
    Arena::Own<std::__cxx11::string>(arena,object);
  }
  return;
}

Assistant:

GOOGLE_ATTRIBUTE_NOINLINE void CreateInstance(::google::protobuf::Arena* arena,
                                         const ::std::string* initial_value) {
    GOOGLE_DCHECK(initial_value != NULL);
    ptr_ = new ::std::string(*initial_value);
    if (arena != NULL) {
      arena->Own(ptr_);
    }
  }